

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

char * __thiscall
llvm::ItaniumPartialDemangler::getFunctionDeclContextName
          (ItaniumPartialDemangler *this,char *Buf,size_t *N)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  LocalName *LN;
  long lVar4;
  StringView R;
  StringView R_00;
  OutputStream S;
  
  bVar2 = isFunction(this);
  if (bVar2) {
    lVar4 = *(long *)((long)this->RootNode + 0x18);
    S.CurrentPackIndex = 0xffffffff;
    S.CurrentPackMax = 0xffffffff;
    bVar2 = anon_unknown.dwarf_38e3a9::initializeOutputStream(Buf,N,&S,0x80);
    if (!bVar2) {
      do {
        cVar1 = *(char *)(lVar4 + 8);
        lVar3 = 0x10;
        if (cVar1 != '\b') {
          if (cVar1 == '\x18') {
            anon_unknown.dwarf_38e3a9::Node::print(*(Node **)(lVar4 + 0x10),&S);
            R.Last = "";
            R.First = "::";
            OutputStream::operator+=(&S,R);
            lVar3 = 0x18;
          }
          else if (cVar1 != '\x1f') {
            if (cVar1 == '\x17') {
              anon_unknown.dwarf_38e3a9::Node::print(*(Node **)(lVar4 + 0x10),&S);
            }
            else if (cVar1 == '!') {
              R_00.Last = "";
              R_00.First = "std";
              OutputStream::operator+=(&S,R_00);
            }
            OutputStream::operator+=(&S,'\0');
            if (N == (size_t *)0x0) {
              return S.Buffer;
            }
            *N = S.CurrentPosition;
            return S.Buffer;
          }
        }
        lVar4 = *(long *)(lVar4 + lVar3);
      } while( true );
    }
  }
  return (char *)0x0;
}

Assistant:

char *ItaniumPartialDemangler::getFunctionDeclContextName(char *Buf,
                                                          size_t *N) const {
  if (!isFunction())
    return nullptr;
  Node *Name = static_cast<FunctionEncoding *>(RootNode)->getName();

  OutputStream S;
  if (initializeOutputStream(Buf, N, S, 128))
    return nullptr;

 KeepGoingLocalFunction:
  while (true) {
    if (Name->getKind() == Node::KAbiTagAttr) {
      Name = static_cast<AbiTagAttr *>(Name)->Base;
      continue;
    }
    if (Name->getKind() == Node::KNameWithTemplateArgs) {
      Name = static_cast<NameWithTemplateArgs *>(Name)->Name;
      continue;
    }
    break;
  }

  switch (Name->getKind()) {
  case Node::KStdQualifiedName:
    S += "std";
    break;
  case Node::KNestedName:
    static_cast<NestedName *>(Name)->Qual->print(S);
    break;
  case Node::KLocalName: {
    auto *LN = static_cast<LocalName *>(Name);
    LN->Encoding->print(S);
    S += "::";
    Name = LN->Entity;
    goto KeepGoingLocalFunction;
  }
  default:
    break;
  }
  S += '\0';
  if (N != nullptr)
    *N = S.getCurrentPosition();
  return S.getBuffer();
}